

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O1

void __thiscall
OpenMD::PotVecAccumulator::get95percentConfidenceInterval(PotVecAccumulator *this,ResultType *ret)

{
  double dVar1;
  size_t sVar2;
  uint i;
  long lVar3;
  double dVar4;
  ResultType local_58;
  
  local_58.data_[4] = 0.0;
  local_58.data_[5] = 0.0;
  local_58.data_[2] = 0.0;
  local_58.data_[3] = 0.0;
  local_58.data_[0] = 0.0;
  local_58.data_[1] = 0.0;
  local_58.data_[6] = 0.0;
  getStdDev(this,&local_58);
  lVar3 = 0;
  do {
    dVar1 = local_58.data_[lVar3];
    sVar2 = (this->super_BaseAccumulator).Count_;
    dVar4 = ((double)CONCAT44(0x45300000,(int)(sVar2 >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0);
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    ret->data_[lVar3] = (dVar1 * 1.96) / dVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 7);
  return;
}

Assistant:

void get95percentConfidenceInterval(ResultType& ret) {
      assert(Count_ != 0);
      ResultType sd;
      this->getStdDev(sd);
      for (unsigned int i = 0; i < N_INTERACTION_FAMILIES; i++) {
        ret[i] = 1.960 * sd[i] / sqrt(RealType(Count_));
      }
      return;
    }